

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity)

{
  uint uVar1;
  REF_LIST pRVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  REF_INT nodes [27];
  uint local_a8 [30];
  
  if (ref_cavity == (REF_CAVITY)0x0) {
    uVar1 = 2;
  }
  else {
    printf("node %d\nnface = %d maxface = %d blankface = %d\n",(ulong)(uint)ref_cavity->node,
           (ulong)(uint)ref_cavity->nface,(ulong)(uint)ref_cavity->maxface,
           (ulong)(uint)ref_cavity->blankface);
    if (0 < ref_cavity->maxface) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        printf(" f2n[%d] = ",uVar4 & 0xffffffff);
        lVar3 = 0;
        do {
          printf(" %d ",(ulong)*(uint *)((long)ref_cavity->f2n + lVar3 * 4 + lVar5));
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        putchar(10);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0xc;
      } while ((long)uVar4 < (long)ref_cavity->maxface);
    }
    uVar1 = ref_list_inspect(ref_cavity->tet_list);
    if (uVar1 == 0) {
      uVar1 = ref_cavity->surf_node;
      if (uVar1 == 0xffffffff) {
        uVar1 = ref_cavity->node;
      }
      printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",(ulong)uVar1,
             (ulong)(uint)ref_cavity->nseg,(ulong)(uint)ref_cavity->maxseg,
             (ulong)(uint)ref_cavity->blankseg);
      if (0 < ref_cavity->maxseg) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          printf(" s2n[%d] = ",uVar4 & 0xffffffff);
          lVar3 = 0;
          do {
            printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar3 * 4 + lVar5));
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          putchar(10);
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0xc;
        } while ((long)uVar4 < (long)ref_cavity->maxseg);
      }
      uVar1 = ref_list_inspect(ref_cavity->tri_list);
      if (uVar1 == 0) {
        pRVar2 = ref_cavity->tri_list;
        if (pRVar2->n < 1) {
          uVar1 = 0;
        }
        else {
          lVar5 = 0;
          do {
            uVar1 = ref_cell_nodes(ref_cavity->ref_grid->cell[3],pRVar2->value[lVar5],
                                   (REF_INT *)local_a8);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x7f,"ref_cavity_inspect",(ulong)uVar1,"cell");
              return uVar1;
            }
            lVar3 = 0;
            do {
              printf(" %d",(ulong)local_a8[lVar3]);
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            putchar(10);
            lVar5 = lVar5 + 1;
            pRVar2 = ref_cavity->tri_list;
            uVar1 = 0;
          } while (lVar5 < pRVar2->n);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x7b,"ref_cavity_inspect",(ulong)uVar1,"insp");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x71
             ,"ref_cavity_inspect",(ulong)uVar1,"insp");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity) {
  REF_INT face, node;
  REF_INT item, cell, i, nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == (void *)ref_cavity) return REF_NULL;

  printf("node %d\nnface = %d maxface = %d blankface = %d\n",
         ref_cavity_node(ref_cavity), ref_cavity_nface(ref_cavity),
         ref_cavity_maxface(ref_cavity), ref_cavity_blankface(ref_cavity));
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    printf(" f2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tet_list(ref_cavity)), "insp");
  printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",
         ref_cavity_seg_node(ref_cavity), ref_cavity_nseg(ref_cavity),
         ref_cavity_maxseg(ref_cavity), ref_cavity_blankseg(ref_cavity));
  for (face = 0; face < ref_cavity_maxseg(ref_cavity); face++) {
    printf(" s2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_s2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tri_list(ref_cavity)), "insp");
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_grid_tri(ref_cavity_grid(ref_cavity)), cell, nodes),
        "cell");
    for (i = 0; i < 4; i++) printf(" %d", nodes[i]);
    printf("\n");
  }
  return REF_SUCCESS;
}